

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O0

PipeThread *
capnp::_::anon_unknown_0::runServer
          (PipeThread *__return_storage_ptr__,AsyncIoProvider *ioProvider,int *callCount,
          int *handleCount)

{
  Type local_48;
  Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)> local_38;
  int *local_28;
  int *handleCount_local;
  int *callCount_local;
  AsyncIoProvider *ioProvider_local;
  
  local_48.callCount = callCount;
  local_48.handleCount = handleCount;
  local_28 = handleCount;
  handleCount_local = callCount;
  callCount_local = (int *)ioProvider;
  ioProvider_local = (AsyncIoProvider *)__return_storage_ptr__;
  kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::
  Function<capnp::_::(anonymous_namespace)::runServer(kj::AsyncIoProvider&,int&,int&)::__0>
            ((Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)> *)&local_38,
             &local_48);
  (*ioProvider->_vptr_AsyncIoProvider[4])
            (__return_storage_ptr__,ioProvider,
             (Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)> *)&local_38);
  kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::~Function
            (&local_38);
  return __return_storage_ptr__;
}

Assistant:

kj::AsyncIoProvider::PipeThread runServer(kj::AsyncIoProvider& ioProvider,
                                          int& callCount, int& handleCount) {
  return ioProvider.newPipeThread(
      [&callCount, &handleCount](
       kj::AsyncIoProvider& ioProvider, kj::AsyncIoStream& stream, kj::WaitScope& waitScope) {
    TwoPartyVatNetwork network(stream, rpc::twoparty::Side::SERVER);
    auto server = makeRpcServer(network, kj::heap<TestInterfaceImpl>(callCount, handleCount));
    network.onDisconnect().wait(waitScope);
  });
}